

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_eval.hpp
# Opt level: O0

Boxed_Value __thiscall
chaiscript::eval::
Binary_Operator_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>::do_oper
          (Binary_Operator_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
           *this,Dispatch_State *t_ss,Opers t_oper,string *t_oper_string,Boxed_Value *t_lhs,
          Boxed_Value *t_rhs)

{
  bool bVar1;
  Type_Info *pTVar2;
  Dispatch_Engine *pDVar3;
  undefined4 in_register_00000014;
  Dispatch_State *t_ds;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  Boxed_Value BVar5;
  string_view t_name;
  Boxed_Value *in_stack_00000008;
  dispatch_error *e;
  __sv_type local_c0;
  Function_Params local_b0;
  undefined1 local_a0 [8];
  array<chaiscript::Boxed_Value,_2UL> params;
  Function_Push_Pop fpp;
  arithmetic_error *anon_var_0;
  Boxed_Value *t_lhs_local;
  string *t_oper_string_local;
  Opers t_oper_local;
  Dispatch_State *t_ss_local;
  Binary_Operator_AST_Node<chaiscript::eval::Tracer<chaiscript::eval::Noop_Tracer_Detail>_>
  *this_local;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  
  t_ds = (Dispatch_State *)CONCAT44(in_register_00000014,t_oper);
  if ((Opers)t_oper_string != invalid) {
    pTVar2 = Boxed_Value::get_type_info(t_rhs);
    bVar1 = Type_Info::is_arithmetic(pTVar2);
    if (bVar1) {
      pTVar2 = Boxed_Value::get_type_info(in_stack_00000008);
      bVar1 = Type_Info::is_arithmetic(pTVar2);
      if (bVar1) {
        BVar5 = Boxed_Number::do_oper
                          ((Boxed_Number *)this,(Opers)t_oper_string,t_rhs,in_stack_00000008);
        _Var4._M_pi = BVar5.m_data.
                      super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi;
        goto LAB_0071a27c;
      }
    }
  }
  detail::Function_Push_Pop::Function_Push_Pop
            ((Function_Push_Pop *)
             &params._M_elems[1].m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,t_ds);
  Boxed_Value::Boxed_Value((Boxed_Value *)local_a0,t_rhs);
  Boxed_Value::Boxed_Value
            ((Boxed_Value *)
             &params._M_elems[0].m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,in_stack_00000008);
  Function_Params::Function_Params<2ul>(&local_b0,(array<chaiscript::Boxed_Value,_2UL> *)local_a0);
  detail::Function_Push_Pop::save_params
            ((Function_Push_Pop *)
             &params._M_elems[1].m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,&local_b0);
  pDVar3 = chaiscript::detail::Dispatch_State::operator->(t_ds);
  local_c0 = std::__cxx11::string::operator_cast_to_basic_string_view((string *)t_lhs);
  Function_Params::Function_Params<2ul>
            ((Function_Params *)&e,(array<chaiscript::Boxed_Value,_2UL> *)local_a0);
  chaiscript::detail::Dispatch_State::conversions(t_ds);
  t_name._M_str = (char *)local_c0._M_len;
  t_name._M_len = (size_t)pDVar3;
  chaiscript::detail::Dispatch_Engine::call_function
            ((Dispatch_Engine *)this,t_name,(atomic_uint_fast32_t *)local_c0._M_str,
             (Function_Params *)&t_ss[3].m_conversions,(Type_Conversions_State *)&e);
  std::array<chaiscript::Boxed_Value,_2UL>::~array((array<chaiscript::Boxed_Value,_2UL> *)local_a0);
  detail::Function_Push_Pop::~Function_Push_Pop
            ((Function_Push_Pop *)
             &params._M_elems[1].m_data.
              super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  _Var4._M_pi = extraout_RDX;
LAB_0071a27c:
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var4._M_pi;
  BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (Boxed_Value)
         BVar5.m_data.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Boxed_Value do_oper(const chaiscript::detail::Dispatch_State &t_ss,
                          Operators::Opers t_oper,
                          const std::string &t_oper_string,
                          const Boxed_Value &t_lhs,
                          const Boxed_Value &t_rhs) const {
        try {
          if (t_oper != Operators::Opers::invalid && t_lhs.get_type_info().is_arithmetic() && t_rhs.get_type_info().is_arithmetic()) {
            // If it's an arithmetic operation we want to short circuit dispatch
            try {
              return Boxed_Number::do_oper(t_oper, t_lhs, t_rhs);
            } catch (const chaiscript::exception::arithmetic_error &) {
              throw;
            } catch (...) {
              throw exception::eval_error("Error with numeric operator calling: " + t_oper_string);
            }
          } else {
            chaiscript::eval::detail::Function_Push_Pop fpp(t_ss);
            std::array<Boxed_Value, 2> params{t_lhs, t_rhs};
            fpp.save_params(Function_Params(params));
            return t_ss->call_function(t_oper_string, m_loc, Function_Params(params), t_ss.conversions());
          }
        } catch (const exception::dispatch_error &e) {
          throw exception::eval_error("Can not find appropriate '" + t_oper_string + "' operator.", e.parameters, e.functions, false, *t_ss);
        }
      }